

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * string_from_abi_cxx11_
                   (string *__return_storage_ptr__,llama_context *ctx,llama_batch *batch)

{
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *p_Var1;
  bool bVar2;
  _Alloc_hider _Var3;
  ostream *poVar4;
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *p_Var5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Alloc_hider this;
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *p_Var6;
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *p_Var7;
  long lVar8;
  long lVar9;
  size_type sVar10;
  size_type sVar11;
  string detokenized;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream buf;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&buf);
  std::operator<<(local_1a8,"[ ");
  bVar2 = true;
  lVar8 = 0;
  do {
    if (batch->n_tokens <= lVar8) {
      std::operator<<(local_1a8," ]");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&buf);
      return __return_storage_ptr__;
    }
    if (!bVar2) {
      std::operator<<(local_1a8,", ");
    }
    __it._M_current = (char *)ctx;
    common_token_to_piece_abi_cxx11_(&detokenized,ctx,batch->token[lVar8],true);
    sVar10 = detokenized._M_string_length;
    _Var3 = detokenized._M_dataplus;
    p_Var1 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *)
             (detokenized._M_dataplus._M_p + detokenized._M_string_length);
    this = detokenized._M_dataplus;
    sVar11 = detokenized._M_string_length;
    for (lVar9 = (long)detokenized._M_string_length >> 2;
        p_Var5 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *
                 )this._M_p, p_Var7 = p_Var1, 0 < lVar9; lVar9 = lVar9 + -1) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
              operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0>
                          *)this._M_p,__it);
      if (bVar2) goto LAB_001bb875;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
              operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0>
                          *)this._M_p + 1,__it);
      p_Var5 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *)
               this._M_p + 1;
      if (bVar2) goto LAB_001bb875;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
              operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0>
                          *)this._M_p + 2,__it);
      p_Var5 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *)
               this._M_p + 2;
      if (bVar2) goto LAB_001bb875;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
              operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0>
                          *)this._M_p + 3,__it);
      p_Var5 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *)
               this._M_p + 3;
      if (bVar2) goto LAB_001bb875;
      this._M_p = this._M_p + 4;
      sVar11 = sVar11 - 4;
    }
    if (sVar11 == 1) {
LAB_001bb85a:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
              operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0>
                          *)this._M_p,__it);
      p_Var5 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *)
               this._M_p;
      if (!bVar2) {
        p_Var5 = p_Var1;
      }
LAB_001bb875:
      p_Var6 = p_Var5;
      if (p_Var5 != p_Var1) {
        while (p_Var5 = p_Var5 + 1, _Var3._M_p = detokenized._M_dataplus._M_p, p_Var7 = p_Var6,
              sVar10 = detokenized._M_string_length, p_Var5 != p_Var1) {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
                  operator()(p_Var5,__it);
          if (!bVar2) {
            *p_Var6 = *p_Var5;
            p_Var6 = p_Var6 + 1;
          }
        }
      }
    }
    else {
      if (sVar11 == 2) {
LAB_001bb84b:
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
                operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0>
                            *)this._M_p,__it);
        p_Var5 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0> *
                 )this._M_p;
        if (!bVar2) {
          this._M_p = this._M_p + 1;
          goto LAB_001bb85a;
        }
        goto LAB_001bb875;
      }
      if (sVar11 == 3) {
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::$_0>::
                operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,llama_batch_const&)::__0>
                            *)this._M_p,__it);
        if (!bVar2) {
          this._M_p = this._M_p + 1;
          goto LAB_001bb84b;
        }
        goto LAB_001bb875;
      }
    }
    std::__cxx11::string::erase(&detokenized,p_Var7,_Var3._M_p + sVar10);
    poVar4 = std::operator<<(local_1a8,"\n");
    std::__cxx11::to_string(&local_1f8,(int)lVar8);
    poVar4 = std::operator<<(poVar4,(string *)&local_1f8);
    poVar4 = std::operator<<(poVar4,", token \'");
    poVar4 = std::operator<<(poVar4,(string *)&detokenized);
    poVar4 = std::operator<<(poVar4,"\'");
    poVar4 = std::operator<<(poVar4,", pos ");
    std::__cxx11::to_string(&local_218,batch->pos[lVar8]);
    poVar4 = std::operator<<(poVar4,(string *)&local_218);
    poVar4 = std::operator<<(poVar4,", n_seq_id ");
    std::__cxx11::to_string(&local_238,batch->n_seq_id[lVar8]);
    poVar4 = std::operator<<(poVar4,(string *)&local_238);
    poVar4 = std::operator<<(poVar4,", seq_id ");
    std::__cxx11::to_string(&local_258,*batch->seq_id[lVar8]);
    poVar4 = std::operator<<(poVar4,(string *)&local_258);
    poVar4 = std::operator<<(poVar4,", logits ");
    std::__cxx11::to_string(&local_1d8,(int)batch->logits[lVar8]);
    std::operator<<(poVar4,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&detokenized);
    lVar8 = lVar8 + 1;
    bVar2 = false;
  } while( true );
}

Assistant:

std::string string_from(const struct llama_context * ctx, const struct llama_batch & batch) {
    std::stringstream buf;

    buf << "[ ";

    bool first = true;
    for (int i = 0; i < batch.n_tokens; ++i) {
        if (!first) {
            buf << ", ";
        } else {
            first = false;
        }

        auto detokenized = common_token_to_piece(ctx, batch.token[i]);

        detokenized.erase(
                std::remove_if(
                    detokenized.begin(),
                    detokenized.end(),
                    [](const unsigned char c) { return !std::isprint(c); }),
                detokenized.end());

        buf << "\n"          << std::to_string(i)
            << ", token '"   << detokenized << "'"
            << ", pos "      << std::to_string(batch.pos[i])
            << ", n_seq_id " << std::to_string(batch.n_seq_id[i])
            << ", seq_id "   << std::to_string(batch.seq_id[i][0])
            << ", logits "   << std::to_string(batch.logits[i]);
    }

    buf << " ]";

    return buf.str();
}